

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# luckySwap.c
# Opt level: O2

uint Kit_TruthSemiCanonicize_Yasha1(word *pInOut,int nVars,char *pCanonPerm,int *pStore)

{
  ushort *puVar1;
  byte bVar2;
  bool bVar3;
  bool bVar4;
  int iVar5;
  int iVar6;
  uint uVar7;
  uint uVar8;
  ulong uVar9;
  int iVar10;
  ulong uVar11;
  
  bVar2 = (byte)nVars;
  iVar10 = 1 << (bVar2 - 6 & 0x1f);
  if (nVars < 7) {
    iVar10 = 1;
  }
  if (0x10 < nVars) {
    __assert_fail("nVars <= 16",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/bool/lucky/luckySwap.c"
                  ,0xfb,"unsigned int Kit_TruthSemiCanonicize_Yasha1(word *, int, char *, int *)");
  }
  iVar5 = Kit_TruthCountOnes_64bit(pInOut,nVars);
  iVar6 = iVar10 * 0x20;
  if (iVar5 == iVar6) {
    uVar8 = 1 << (bVar2 + 2 & 0x1f);
  }
  else {
    uVar8 = 0;
    if (iVar5 != iVar6 && SBORROW4(iVar5,iVar6) == iVar5 + iVar10 * -0x20 < 0) {
      uVar8 = 1 << (bVar2 & 0x1f);
      Kit_TruthNot_64bit(pInOut,nVars);
      iVar5 = iVar10 * 0x40 - iVar5;
    }
  }
  Kit_TruthCountOnesInCofs_64bit(pInOut,nVars,pStore);
  uVar11 = 0;
  uVar9 = 0;
  if (0 < nVars) {
    uVar9 = (ulong)(uint)nVars;
  }
  for (; uVar9 != uVar11; uVar11 = uVar11 + 1) {
    iVar10 = pStore[uVar11];
    if (iVar10 * 2 == iVar5) {
      uVar8 = uVar8 | 1 << (bVar2 + 1 & 0x1f);
    }
    else if (iVar10 <= iVar5 - iVar10) {
      uVar8 = uVar8 | 1 << ((uint)uVar11 & 0x1f);
      pStore[uVar11] = iVar5 - iVar10;
      Kit_TruthChangePhase_64bit(pInOut,nVars,(uint)uVar11);
    }
  }
  iVar10 = 1;
  if (1 < nVars) {
    iVar10 = nVars;
  }
  bVar4 = true;
  uVar9 = 0;
  do {
    while (uVar11 = uVar9, iVar10 - 1 != uVar11) {
      uVar9 = uVar11 + 1;
      if (pStore[uVar11 + 1] < pStore[uVar11]) {
        puVar1 = (ushort *)(pCanonPerm + uVar11);
        *puVar1 = *puVar1 << 8 | *puVar1 >> 8;
        *(ulong *)(pStore + uVar11) =
             CONCAT44((int)*(undefined8 *)(pStore + uVar11),
                      (int)((ulong)*(undefined8 *)(pStore + uVar11) >> 0x20));
        uVar7 = 2 << ((byte)uVar11 & 0x1f);
        if ((((uVar8 & uVar7) == 0 ^ (byte)(uVar8 >> ((byte)uVar11 & 0x1f))) & 1) == 0) {
          uVar8 = uVar8 ^ 1 << ((uint)uVar11 & 0x1f) ^ uVar7;
        }
        Kit_TruthSwapAdjacentVars_64bit(pInOut,nVars,(uint)uVar11);
        bVar4 = false;
      }
    }
    bVar3 = !bVar4;
    uVar9 = 0;
    bVar4 = true;
  } while (bVar3);
  return uVar8;
}

Assistant:

unsigned  Kit_TruthSemiCanonicize_Yasha1( word* pInOut, int nVars, char * pCanonPerm, int * pStore )
{
    int nWords = Kit_TruthWordNum_64bit( nVars );
    int i, fChange, nOnes;
    int Temp;
    unsigned  uCanonPhase=0;
    assert( nVars <= 16 );
    
    nOnes = Kit_TruthCountOnes_64bit(pInOut, nVars);
    if ( nOnes == nWords * 32 )
        uCanonPhase |= (1 << (nVars+2));
    
    else if ( (nOnes > nWords * 32) )
    {
        uCanonPhase |= (1 << nVars);
        Kit_TruthNot_64bit( pInOut, nVars );
        nOnes = nWords*64 - nOnes;
    }
    
    // collect the minterm counts
    Kit_TruthCountOnesInCofs_64bit( pInOut, nVars, pStore );
    
    // canonicize phase
    for ( i = 0; i < nVars; i++ )
    {
        if (  2*pStore[i]  == nOnes)
        {
            uCanonPhase |= (1 << (nVars+1));
            continue;
        }
        if ( pStore[i] > nOnes-pStore[i])
            continue;
        uCanonPhase |= (1 << i);
        pStore[i] = nOnes-pStore[i]; 
        Kit_TruthChangePhase_64bit( pInOut, nVars, i );
    }  
    
    do {
        fChange = 0;
        for ( i = 0; i < nVars-1; i++ )
        {
            if ( pStore[i] <= pStore[i+1] )
                continue;            
            fChange = 1;
            
            Temp = pCanonPerm[i];
            pCanonPerm[i] = pCanonPerm[i+1];
            pCanonPerm[i+1] = Temp;
            
            Temp = pStore[i];
            pStore[i] = pStore[i+1];
            pStore[i+1] = Temp;
            
            // if the polarity of variables is different, swap them
            if ( ((uCanonPhase & (1 << i)) > 0) != ((uCanonPhase & (1 << (i+1))) > 0) )
            {
                uCanonPhase ^= (1 << i);
                uCanonPhase ^= (1 << (i+1));
            }
            
            Kit_TruthSwapAdjacentVars_64bit( pInOut, nVars, i );            
        }
    } while ( fChange );
    return uCanonPhase;
}